

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  byte bVar1;
  uint32_t uVar2;
  Nonnull<const_char_*> pcVar3;
  bool bVar4;
  char *description;
  OneofDescriptor *oneof_descriptor;
  Descriptor *pDVar5;
  Metadata MVar6;
  
  MVar6 = Message::GetMetadata(message);
  if (MVar6.reflection != this) {
    pDVar5 = this->descriptor_;
    MVar6 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,MVar6.descriptor,field,"HasField");
  }
  pDVar5 = this->descriptor_;
  if (field->containing_type_ == pDVar5) {
    bVar1 = field->field_0x1;
    bVar4 = (bool)((bVar1 & 0x20) >> 5);
    if (0xbf < bVar1 == bVar4) {
      pcVar3 = (Nonnull<const_char_*>)0x0;
    }
    else {
      pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                         (bVar4,0xbf < bVar1,
                          "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
    }
    if (pcVar3 == (Nonnull<const_char_*>)0x0) {
      if ((field->field_0x1 & 0x20) == 0) {
        if ((field->field_0x1 & 8) != 0) {
          uVar2 = protobuf::internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
          bVar4 = protobuf::internal::ExtensionSet::Has
                            ((ExtensionSet *)
                             ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                             field->number_);
          return bVar4;
        }
        bVar4 = protobuf::internal::ReflectionSchema::InRealOneof(&this->schema_,field);
        if (bVar4) {
          if ((field->field_0x1 & 0x10) == 0) {
            oneof_descriptor = (OneofDescriptor *)0x0;
          }
          else {
            oneof_descriptor = (field->scope_).containing_oneof;
            if (oneof_descriptor == (OneofDescriptor *)0x0) {
              protobuf::internal::protobuf_assumption_failed
                        ("res != nullptr",
                         "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                         ,0xb31);
            }
          }
          uVar2 = GetOneofCase(this,message,oneof_descriptor);
          return uVar2 == field->number_;
        }
        bVar4 = HasFieldSingular(this,message,field);
        return bVar4;
      }
    }
    else {
      HasField();
    }
    pDVar5 = this->descriptor_;
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar5,field,"HasField",description);
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE(HasField, &message);
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (schema_.InRealOneof(field)) {
      return HasOneofField(message, field);
    } else {
      return HasFieldSingular(message, field);
    }
  }
}